

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::Skeleton(Skeleton *this,Mesh *mesh)

{
  Joint *pJVar1;
  double in_RSI;
  Matrix4x4 *in_RDI;
  Vector3D *in_stack_00000180;
  Joint *in_stack_00000188;
  Skeleton *in_stack_00000190;
  SceneObject *in_stack_ffffffffffffffd0;
  
  SceneObject::SceneObject(in_stack_ffffffffffffffd0);
  in_RDI->entries[0].x = (double)&PTR_set_draw_styles_003ba760;
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::vector
            ((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              *)0x21dded);
  Matrix4x4::Matrix4x4(in_RDI);
  std::
  map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
  ::map((map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
         *)0x21de16);
  in_RDI[1].entries[3].z = in_RSI;
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::clear
            ((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
              *)0x21de33);
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffffc8,0.0,0.0,0.0);
  pJVar1 = createNewJoint(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  in_RDI[1].entries[3].w = (double)pJVar1;
  return;
}

Assistant:

Skeleton::Skeleton(Mesh* mesh) {
  this->mesh = mesh;
  joints.clear();
  root = createNewJoint(nullptr, Vector3D(0, 0, 0));
}